

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

void __thiscall ncnn::Mat::create(Mat *this,int _w,size_t _elemsize,Allocator *_allocator)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  void *ptr;
  void *local_30;
  
  if ((((this->dims != 1) || (this->w != _w)) || (this->elemsize != _elemsize)) ||
     ((this->elempack != 1 || (this->allocator != _allocator)))) {
    piVar1 = this->refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (this->allocator == (Allocator *)0x0) {
          if (this->data != (void *)0x0) {
            free(this->data);
          }
        }
        else {
          (**(code **)(*(long *)this->allocator + 0x18))();
        }
      }
    }
    this->data = (void *)0x0;
    this->refcount = (int *)0x0;
    this->elemsize = _elemsize;
    this->elempack = 1;
    this->allocator = _allocator;
    this->dims = 1;
    this->w = _w;
    this->h = 1;
    this->c = 1;
    this->cstep = (long)_w;
    if (_w != 0) {
      uVar4 = (long)_w * _elemsize + 3 & 0xfffffffffffffffc;
      if (_allocator == (Allocator *)0x0) {
        local_30 = (void *)0x0;
        iVar2 = posix_memalign(&local_30,0x10,uVar4 + 4);
        pvVar3 = (void *)0x0;
        if (iVar2 == 0) {
          pvVar3 = local_30;
        }
      }
      else {
        pvVar3 = (void *)(**(code **)(*(long *)_allocator + 0x10))(_allocator,uVar4 + 4);
      }
      this->data = pvVar3;
      this->refcount = (int *)((long)pvVar3 + uVar4);
      *(undefined4 *)((long)pvVar3 + uVar4) = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 1 && w == _w && elemsize == _elemsize && elempack == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    elempack = 1;
    allocator = _allocator;

    dims = 1;
    w = _w;
    h = 1;
    c = 1;

    cstep = w;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}